

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderProgram.cpp
# Opt level: O2

void __thiscall glu::Shader::compile(Shader *this)

{
  GLenum GVar1;
  deUint64 dVar2;
  deUint64 dVar3;
  long lVar4;
  allocator_type local_61;
  int unusedLen;
  int infoLogLen;
  int compileStatus;
  uint uStack_54;
  undefined1 local_48 [16];
  vector<char,_std::allocator<char>_> infoLog;
  
  (this->m_info).compileOk = false;
  (this->m_info).compileTimeUs = 0;
  (this->m_info).infoLog._M_string_length = 0;
  *(this->m_info).infoLog._M_dataplus._M_p = '\0';
  dVar2 = deGetMicroseconds();
  (*this->m_gl->compileShader)(this->m_shader);
  dVar3 = deGetMicroseconds();
  (this->m_info).compileTimeUs = dVar3 - dVar2;
  GVar1 = (*this->m_gl->getError)();
  checkError(GVar1,"glCompileShader()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluShaderProgram.cpp"
             ,0x5a);
  _compileStatus = (undefined1 *)((ulong)uStack_54 << 0x20);
  (*this->m_gl->getShaderiv)(this->m_shader,0x8b81,&compileStatus);
  GVar1 = (*this->m_gl->getError)();
  checkError(GVar1,"glGetShaderiv()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluShaderProgram.cpp"
             ,0x61);
  (this->m_info).compileOk = compileStatus != 0;
  infoLogLen = 0;
  (*this->m_gl->getShaderiv)(this->m_shader,0x8b84,&infoLogLen);
  GVar1 = (*this->m_gl->getError)();
  checkError(GVar1,"glGetShaderiv()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluShaderProgram.cpp"
             ,0x6c);
  if (0 < infoLogLen) {
    _compileStatus = (undefined1 *)((ulong)_compileStatus & 0xffffffffffffff00);
    std::vector<char,_std::allocator<char>_>::vector
              (&infoLog,(long)(infoLogLen + 3),(value_type *)&compileStatus,&local_61);
    (*this->m_gl->getShaderInfoLog)
              (this->m_shader,
               ~(uint)infoLog.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start +
               (int)infoLog.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish,&unusedLen,
               infoLog.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start);
    lVar4 = CONCAT44(infoLog.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish._4_4_,
                     (int)infoLog.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_finish) -
            (long)infoLog.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (infoLog.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start[(int)lVar4 + -1] == '\0') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&compileStatus,
                 infoLog.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,&local_61);
    }
    else {
      _compileStatus = local_48;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&compileStatus,
                 infoLog.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 infoLog.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar4);
    }
    std::__cxx11::string::operator=((string *)&(this->m_info).infoLog,(string *)&compileStatus);
    std::__cxx11::string::~string((string *)&compileStatus);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&infoLog.super__Vector_base<char,_std::allocator<char>_>);
  }
  return;
}

Assistant:

void Shader::compile (void)
{
	m_info.compileOk		= false;
	m_info.compileTimeUs	= 0;
	m_info.infoLog.clear();

	{
		deUint64 compileStart = deGetMicroseconds();
		m_gl.compileShader(m_shader);
		m_info.compileTimeUs = deGetMicroseconds() - compileStart;
	}

	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glCompileShader()");

	// Query status
	{
		int compileStatus = 0;

		m_gl.getShaderiv(m_shader, GL_COMPILE_STATUS, &compileStatus);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGetShaderiv()");

		m_info.compileOk = compileStatus != GL_FALSE;
	}

	// Query log
	{
		int infoLogLen = 0;
		int unusedLen;

		m_gl.getShaderiv(m_shader, GL_INFO_LOG_LENGTH, &infoLogLen);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGetShaderiv()");

		if (infoLogLen > 0)
		{
			// The INFO_LOG_LENGTH query and the buffer query implementations have
			// very commonly off-by-one errors. Try to work around these issues.

			// add tolerance for off-by-one in log length, buffer write, and for terminator
			std::vector<char> infoLog(infoLogLen + 3, '\0');

			// claim buf size is one smaller to protect from off-by-one writing over buffer bounds
			m_gl.getShaderInfoLog(m_shader, (int)infoLog.size() - 1, &unusedLen, &infoLog[0]);

			if (infoLog[(int)(infoLog.size()) - 1] != '\0')
			{
				// return whole buffer if null terminator was overwritten
				m_info.infoLog = std::string(&infoLog[0], infoLog.size());
			}
			else
			{
				// read as C string. infoLog is guaranteed to be 0-terminated
				m_info.infoLog = std::string(&infoLog[0]);
			}
		}
	}
}